

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_quadrature.hpp
# Opt level: O3

int __thiscall
IntegratorXX::
SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Delley<double>_>
::clone(SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Delley<double>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 local_29;
  SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Delley<double>_>
  *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Delley<double>_>
              *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,IntegratorXX::Delley<double>>,std::allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,IntegratorXX::Delley<double>>>,IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,IntegratorXX::Delley<double>>const&>
            (a_Stack_20,&local_28,
             (allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Delley<double>_>_>
              *)&local_29,
             (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Delley<double>_>
              *)__fn);
  (this->
  super_SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  )._vptr_SphericalQuadratureBase = (_func_int **)local_28;
  (this->
  super_SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ).center_._M_elems[0] = (double)a_Stack_20[0]._M_pi;
  return (int)this;
}

Assistant:

std::shared_ptr<sph_base> clone() const override {
    return std::make_shared<self_type>( *this );
  }